

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O0

void P_RecalculateLights(sector_t_conflict *sector)

{
  uint uVar1;
  anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0 aVar2;
  TArray<lightlist_t,_lightlist_t> *this;
  lightlist_t *plVar3;
  lightlist_t *ll;
  uint i;
  TArray<lightlist_t,_lightlist_t> *lightlist;
  sector_t_conflict *sector_local;
  
  this = &(sector->e->XFloor).lightlist;
  ll._4_4_ = 0;
  while( true ) {
    uVar1 = TArray<lightlist_t,_lightlist_t>::Size(this);
    if (uVar1 <= ll._4_4_) break;
    plVar3 = TArray<lightlist_t,_lightlist_t>::operator[](this,(ulong)ll._4_4_);
    if (plVar3->lightsource == (F3DFloor *)0x0) {
      plVar3->extra_colormap = sector->ColorMap;
      PalEntry::operator=(&plVar3->blend,0);
    }
    else {
      F3DFloor::UpdateColormap(plVar3->lightsource,&plVar3->extra_colormap);
      aVar2 = (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)
              F3DFloor::GetBlend(plVar3->lightsource);
      (plVar3->blend).field_0.field_0 = aVar2;
    }
    ll._4_4_ = ll._4_4_ + 1;
  }
  return;
}

Assistant:

void P_RecalculateLights(sector_t *sector)
{
	TArray<lightlist_t> &lightlist = sector->e->XFloor.lightlist;

	for(unsigned i = 0; i < lightlist.Size(); i++)
	{
		lightlist_t *ll = &lightlist[i];
		if (ll->lightsource != NULL)
		{
			ll->lightsource->UpdateColormap(ll->extra_colormap);
			ll->blend = ll->lightsource->GetBlend();
		}
		else
		{
			ll->extra_colormap = sector->ColorMap;
			ll->blend = 0;
		}
	}
}